

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SenderFlow.cpp
# Opt level: O2

void __thiscall SenderFlow::SenderFlow(SenderFlow *this,string *bind,int port)

{
  int iVar1;
  void *pvVar2;
  ostream *poVar3;
  SenderFlowEx *pSVar4;
  int *piVar5;
  char *pcVar6;
  int linger;
  undefined4 uStack_38c;
  string local_370;
  string local_350;
  stringstream notf_addr;
  ostream local_320 [376];
  stringstream stream_addr;
  ostream local_198 [376];
  
  pvVar2 = (void *)zmq_ctx_new();
  this->m_context = pvVar2;
  pvVar2 = (void *)zmq_socket(pvVar2,8);
  this->m_stream_socket = pvVar2;
  pvVar2 = (void *)zmq_socket(this->m_context,1);
  this->m_notif_socket = pvVar2;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream_addr);
  poVar3 = std::operator<<(local_198,(string *)bind);
  poVar3 = std::operator<<(poVar3,":");
  std::ostream::operator<<(poVar3,port);
  std::__cxx11::stringstream::stringstream((stringstream *)&notf_addr);
  poVar3 = std::operator<<(local_320,(string *)bind);
  poVar3 = std::operator<<(poVar3,":");
  std::ostream::operator<<(poVar3,port + 1);
  pvVar2 = this->m_stream_socket;
  std::__cxx11::stringbuf::str();
  iVar1 = zmq_bind(pvVar2,CONCAT44(uStack_38c,linger));
  std::__cxx11::string::~string((string *)&linger);
  if (iVar1 == -1) {
    pSVar4 = (SenderFlowEx *)__cxa_allocate_exception(0x10);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,pcVar6,(allocator<char> *)&linger);
    SenderFlowEx::SenderFlowEx(pSVar4,&local_350);
    __cxa_throw(pSVar4,&SenderFlowEx::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = this->m_notif_socket;
  std::__cxx11::stringbuf::str();
  iVar1 = zmq_bind(pvVar2,CONCAT44(uStack_38c,linger));
  std::__cxx11::string::~string((string *)&linger);
  if (iVar1 != -1) {
    linger = -1;
    zmq_setsockopt(this->m_stream_socket,0x11,&linger,4);
    zmq_setsockopt(this->m_notif_socket,0x11,&linger,4);
    std::__cxx11::stringstream::~stringstream((stringstream *)&notf_addr);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream_addr);
    return;
  }
  pSVar4 = (SenderFlowEx *)__cxa_allocate_exception(0x10);
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,pcVar6,(allocator<char> *)&linger);
  SenderFlowEx::SenderFlowEx(pSVar4,&local_370);
  __cxa_throw(pSVar4,&SenderFlowEx::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SenderFlow::SenderFlow(std::string bind, int port) :
    m_context(zmq_ctx_new()),
    m_stream_socket(zmq_socket(m_context, ZMQ_PUSH)),
    m_notif_socket(zmq_socket(m_context, ZMQ_PUB))
{
    // prepare full address
    std::stringstream stream_addr;
    stream_addr << bind << ":" << port;
    std::stringstream notf_addr;
    notf_addr << bind << ":" << (port + 1);
    // bind the port for the stream endpoint
    int rc = zmq_bind(m_stream_socket, stream_addr.str().c_str());
    if (rc == -1) {
        throw SenderFlowEx(strerror(errno));
    }
    // bind the port for the notification channel endpoint
    rc = zmq_bind(m_notif_socket, notf_addr.str().c_str());
    if (rc == -1) {
        throw SenderFlowEx(strerror(errno));
    }
    int linger = -1;
    zmq_setsockopt(m_stream_socket, ZMQ_LINGER, &linger, sizeof(linger));
    zmq_setsockopt(m_notif_socket, ZMQ_LINGER, &linger, sizeof(linger));
}